

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void lyxp_set_scnode_merge(lyxp_set *set1,lyxp_set *set2)

{
  uint uVar1;
  int iVar2;
  lyxp_set_scnode *plVar3;
  lyxp_set_scnode *plVar4;
  undefined4 uVar5;
  lyxp_node_type lVar6;
  int32_t iVar7;
  uint uVar8;
  lyxp_set_node *plVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  if ((set1->type != LYXP_SET_SCNODE_SET) || (set2->type != LYXP_SET_SCNODE_SET)) {
    __assert_fail("(set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x4ed,"void lyxp_set_scnode_merge(struct lyxp_set *, struct lyxp_set *)");
  }
  uVar11 = set2->used;
  if (uVar11 == 0) {
    return;
  }
  uVar8 = set1->used;
  if (uVar8 == 0) {
    lyxp_set_free_content(set1);
    memcpy(set1,set2,0x90);
    return;
  }
  uVar1 = uVar8 + uVar11;
  if (set1->size < uVar1) {
    set1->size = uVar1;
    plVar9 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar1 * 0x18);
    (set1->val).nodes = plVar9;
    if (plVar9 == (lyxp_set_node *)0x0) {
      ly_log(set1->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_set_scnode_merge");
      return;
    }
    uVar11 = set2->used;
    if (uVar11 == 0) goto LAB_001a2ef8;
    uVar8 = set1->used;
  }
  uVar10 = 0;
  uVar12 = (ulong)uVar8;
  do {
    plVar3 = (set1->val).scnodes;
    plVar4 = (set2->val).scnodes;
    if (uVar8 != 0) {
      lVar13 = 0;
      do {
        if (*(lysc_node **)((long)&plVar3->scnode + lVar13) == plVar4[uVar10].scnode) {
          iVar2 = *(int *)((long)&plVar3->in_ctx + lVar13);
          if (iVar2 == 0) {
            if (plVar4[uVar10].in_ctx == 1) {
              *(undefined4 *)((long)&plVar3->in_ctx + lVar13) = 1;
            }
          }
          else if (iVar2 == -1) {
            *(int32_t *)((long)&plVar3->in_ctx + lVar13) = plVar4[uVar10].in_ctx;
          }
          goto LAB_001a2ebe;
        }
        lVar13 = lVar13 + 0x18;
      } while ((ulong)uVar8 * 0x18 != lVar13);
    }
    uVar5 = *(undefined4 *)&plVar4[uVar10].field_0x14;
    plVar3[uVar12].axis = plVar4[uVar10].axis;
    *(undefined4 *)&plVar3[uVar12].field_0x14 = uVar5;
    plVar4 = plVar4 + uVar10;
    lVar6 = plVar4->type;
    iVar7 = plVar4->in_ctx;
    plVar3 = plVar3 + uVar12;
    plVar3->scnode = plVar4->scnode;
    plVar3->type = lVar6;
    plVar3->in_ctx = iVar7;
    uVar11 = set1->used + 1;
    uVar12 = (ulong)uVar11;
    set1->used = uVar11;
    uVar11 = set2->used;
LAB_001a2ebe:
    uVar10 = uVar10 + 1;
  } while (uVar10 < uVar11);
LAB_001a2ef8:
  lyxp_set_free_content(set2);
  set2->type = LYXP_SET_SCNODE_SET;
  return;
}

Assistant:

void
lyxp_set_scnode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert((set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET));

    if (!set2->used) {
        return;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.scnodes = ly_realloc(set1->val.scnodes, set1->size * sizeof *set1->val.scnodes);
        LY_CHECK_ERR_RET(!set1->val.scnodes, LOGMEM(set1->ctx), );
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.scnodes[j].scnode == set2->val.scnodes[i].scnode) {
                break;
            }
        }

        if (j < orig_used) {
            /* node is there, but update its status if needed */
            if (set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_START_USED) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            } else if ((set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) &&
                    (set2->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL)) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            }
        } else {
            memcpy(&set1->val.scnodes[set1->used], &set2->val.scnodes[i], sizeof *set2->val.scnodes);
            ++set1->used;
        }
    }

    lyxp_set_free_content(set2);
    set2->type = LYXP_SET_SCNODE_SET;
}